

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tourmng.cpp
# Opt level: O0

string * banksia::TourMng::createLogPath
                   (string *opath,bool onefile,bool usesurfix,bool includeGameResult,Game *game,
                   Side forSide)

{
  Player *pPVar1;
  byte in_CL;
  byte in_DL;
  string *in_RSI;
  string *in_RDI;
  byte in_R8B;
  Game *in_R9;
  int in_stack_00000008;
  size_type p;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  allocator *paVar2;
  Player *in_stack_fffffffffffffe48;
  string *__lhs;
  string local_180 [12];
  int in_stack_fffffffffffffe8c;
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  long local_100;
  string local_f8 [15];
  undefined1 in_stack_ffffffffffffff17;
  Game *in_stack_ffffffffffffff18;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [36];
  undefined4 local_74;
  allocator local_6d [13];
  string local_60 [32];
  string local_40 [32];
  Game *local_20;
  byte local_13;
  byte local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_13 = in_R8B & 1;
  if ((local_11 != 0) || (in_R9 == (Game *)0x0)) {
    std::__cxx11::string::string((string *)in_RDI,in_RSI);
    return in_RDI;
  }
  __lhs = in_RDI;
  local_20 = in_R9;
  Game::getIdx(in_R9);
  std::__cxx11::to_string(in_stack_fffffffffffffe8c);
  std::operator+((char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  std::__cxx11::string::~string(local_60);
  if ((local_12 & 1) != 0) {
    pPVar1 = Game::getPlayer(local_20,white);
    if ((pPVar1 == (Player *)0x0) ||
       (in_stack_fffffffffffffe48 = Game::getPlayer(local_20,black),
       in_stack_fffffffffffffe48 == (Player *)0x0)) {
      paVar2 = local_6d;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"",paVar2);
      std::allocator<char>::~allocator((allocator<char> *)local_6d);
      goto LAB_0019c540;
    }
    Game::getGameTitleString_abi_cxx11_(in_stack_ffffffffffffff18,(bool)in_stack_ffffffffffffff17);
    std::operator+((char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    std::__cxx11::string::operator+=(local_40,local_98);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_b8);
  }
  if (in_stack_00000008 != 2) {
    side2String_abi_cxx11_((Side)((ulong)__lhs >> 0x20),SUB81((ulong)__lhs >> 0x18,0));
    std::operator+((char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    std::__cxx11::string::operator+=(local_40,local_d8);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_f8);
  }
  local_100 = std::__cxx11::string::rfind((char *)in_RSI,0x1ff730);
  if (local_100 == -1) {
    std::__cxx11::string::operator+=(in_RSI,local_40);
  }
  else {
    std::__cxx11::string::substr((ulong)local_160,(ulong)in_RSI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    std::__cxx11::string::substr((ulong)local_180,(ulong)in_RSI);
    std::operator+(__lhs,in_RDI);
    std::__cxx11::string::operator=(in_RSI,local_120);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_160);
  }
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
LAB_0019c540:
  local_74 = 1;
  std::__cxx11::string::~string(local_40);
  return __lhs;
}

Assistant:

std::string TourMng::createLogPath(std::string opath, bool onefile, bool usesurfix, bool includeGameResult, const Game* game, Side forSide)
{
    if (onefile || game == nullptr) return opath;
    
    std::string s = (usesurfix ? ", " : "-") + std::to_string(game->getIdx() + 1);
    if (usesurfix) {
        if (!game->getPlayer(Side::white) || !game->getPlayer(Side::black)) {
            return "";
        }
        s += ") " + game->getGameTitleString(includeGameResult);
    }
    
    if (forSide != Side::none) {
        s += ", " + side2String(forSide, true);
    }
    
    auto p = opath.rfind(".");
    if (p == std::string::npos) {
        opath += s;
    } else {
        opath = opath.substr(0, p) + s + opath.substr(p);
    }
    return opath;
}